

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celf.h
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
CELF::celfalgo(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
              Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list,
              CascadeModel model)

{
  double dVar1;
  pointer puVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  _Elt_pointer ptVar4;
  _Elt_pointer ptVar5;
  _Elt_pointer ptVar6;
  _Elt_pointer ptVar7;
  _Elt_pointer ptVar8;
  _Elt_pointer ptVar9;
  _Map_pointer pptVar10;
  value_type_conflict2 *__val;
  clock_t cVar11;
  clock_t cVar12;
  ostream *poVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  _Map_pointer pptVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_CB;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_UC;
  tuple<unsigned_long,_double,_double,_unsigned_long> u;
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  Q_CB;
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  Q_UC;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecSeed;
  double local_210;
  double local_208;
  double local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  double local_1b0;
  tuple<unsigned_long,_double,_double,_unsigned_long> local_1a8;
  unsigned_long local_188;
  double dStack_180;
  double local_178;
  unsigned_long uStack_170;
  _Elt_pointer local_168;
  vector<double,_std::allocator<double>_> *local_160;
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  local_158;
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  _Elt_pointer local_98;
  _Elt_pointer local_90;
  _Elt_pointer local_88;
  _Map_pointer local_80;
  _Elt_pointer local_78;
  _Elt_pointer local_70;
  _Elt_pointer local_68;
  _Map_pointer local_60;
  _Elt_pointer local_58;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Map_pointer local_40;
  _Elt_pointer local_38;
  
  local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1b0 = budget;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::_M_initialize_map(&local_108,0);
  local_158._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_158._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::_M_initialize_map(&local_158,0);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = __return_storage_ptr__;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_160 = budget_list;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  cVar11 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initial deque start",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  pvVar3 = local_160;
  if ((graph->
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (graph->
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    pptVar18 = (_Map_pointer)0x0;
    do {
      *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start = (unsigned_long)pptVar18;
      dVar1 = GraphBase::inf_eval(graph,&local_b8,model,10000);
      local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
      super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
      _M_head_impl = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)pptVar18];
      local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
      super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
      super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
           (_Head_base<3UL,_unsigned_long,_false>)0;
      local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = dVar1;
      local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = (unsigned_long)pptVar18;
      std::
      deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
      ::emplace_back<std::tuple<unsigned_long,double,double,unsigned_long>>
                ((deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
                  *)&local_108,&local_1a8);
      local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
      super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
      _M_head_impl = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)pptVar18];
      local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = dVar1 / local_1a8.
                             super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
                             super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                             super__Tuple_impl<2UL,_double,_unsigned_long>.
                             super__Head_base<2UL,_double,_false>._M_head_impl;
      local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
      super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
      super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
           (_Head_base<3UL,_unsigned_long,_false>)0;
      local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = (unsigned_long)pptVar18;
      std::
      deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
      ::emplace_back<std::tuple<unsigned_long,double,double,unsigned_long>>
                ((deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
                  *)&local_158,&local_1a8);
      pptVar18 = (_Map_pointer)((long)pptVar18 + 1);
    } while (pptVar18 <
             (_Map_pointer)
             (((long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initial deque end",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  cVar12 = clock();
  poVar13 = std::ostream::_M_insert<double>((double)((cVar12 - cVar11) / 1000000));
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," s",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  pptVar10 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
  ptVar9 = local_108._M_impl.super__Deque_impl_data._M_finish._M_last;
  ptVar8 = local_108._M_impl.super__Deque_impl_data._M_finish._M_first;
  ptVar7 = local_108._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar18 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar6 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
  ptVar5 = local_108._M_impl.super__Deque_impl_data._M_start._M_first;
  ptVar4 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_108._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_108._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)
         (_Head_base<3UL,_unsigned_long,_false>)
         local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (double)local_108._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = (double)local_108._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (unsigned_long)local_108._M_impl.super__Deque_impl_data._M_start._M_node;
    local_58 = local_108._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_50 = local_108._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_48 = local_108._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_40 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar16 = ((long)local_108._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_108._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
             ((long)local_108._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_108._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
             ((((ulong)((long)local_108._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_108._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_108._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 0x10;
    lVar15 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>>
              (&local_1a8,&local_58,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
    local_78 = ptVar4;
    local_70 = ptVar5;
    local_68 = ptVar6;
    local_60 = pptVar18;
    local_98 = ptVar7;
    local_90 = ptVar8;
    local_88 = ptVar9;
    local_80 = pptVar10;
    std::
    __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>>
              ();
  }
  pptVar10 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node;
  ptVar9 = local_158._M_impl.super__Deque_impl_data._M_finish._M_last;
  ptVar8 = local_158._M_impl.super__Deque_impl_data._M_finish._M_first;
  ptVar7 = local_158._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar18 = local_158._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar6 = local_158._M_impl.super__Deque_impl_data._M_start._M_last;
  ptVar5 = local_158._M_impl.super__Deque_impl_data._M_start._M_first;
  ptVar4 = local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_158._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_158._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)
         (_Head_base<3UL,_unsigned_long,_false>)
         local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (double)local_158._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = (double)local_158._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (unsigned_long)local_158._M_impl.super__Deque_impl_data._M_start._M_node;
    local_58 = local_158._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_50 = local_158._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_48 = local_158._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_40 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar16 = ((long)local_158._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_158._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
             ((long)local_158._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_158._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
             ((((ulong)((long)local_158._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_158._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_158._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 0x10;
    lVar15 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>>
              (&local_1a8,&local_58,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
    local_78 = ptVar4;
    local_70 = ptVar5;
    local_68 = ptVar6;
    local_60 = pptVar18;
    local_98 = ptVar7;
    local_90 = ptVar8;
    local_88 = ptVar9;
    local_80 = pptVar10;
    std::
    __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>>
              ();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start UC",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_208 = 0.0;
  if (0.0 < local_1b0) {
    local_208 = 0.0;
    local_210 = 0.0;
    do {
      while (((local_108._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
             super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
             super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
             _M_head_impl + local_210 <= local_1b0) {
        if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_108._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011a820;
        local_188 = ((local_108._M_impl.super__Deque_impl_data._M_start._M_cur)->
                    super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                    super__Tuple_impl<2UL,_double,_unsigned_long>.
                    super__Tuple_impl<3UL,_unsigned_long>.
                    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl;
        dStack_180 = ((local_108._M_impl.super__Deque_impl_data._M_start._M_cur)->
                     super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                     super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                     super__Tuple_impl<2UL,_double,_unsigned_long>.
                     super__Head_base<2UL,_double,_false>._M_head_impl;
        local_178 = ((local_108._M_impl.super__Deque_impl_data._M_start._M_cur)->
                    super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                    super__Head_base<1UL,_double,_false>._M_head_impl;
        uStack_170 = ((local_108._M_impl.super__Deque_impl_data._M_start._M_cur)->
                     super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                     super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        if (local_188 ==
            (long)local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) {
          if (local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1c8,
                       (iterator)
                       local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&uStack_170);
          }
          else {
            *local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = uStack_170;
            local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          if (local_108._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_108._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_108._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_108._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_108._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
            local_108._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_108._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_108._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          local_210 = local_210 + dStack_180;
          local_208 = GraphBase::inf_eval(graph,&local_1c8,model,10000);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"UC push new seed: ",0x12);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          if ((long)local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0) {
            dVar1 = 0.0;
          }
          else {
            lVar15 = (long)local_1c8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1c8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            dVar1 = 0.0;
            lVar17 = 0;
            do {
              dVar1 = dVar1 + (local_160->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start
                              [local_1c8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar17]];
              lVar17 = lVar17 + 1;
            } while (lVar15 + (ulong)(lVar15 == 0) != lVar17);
          }
          poVar13 = std::ostream::_M_insert<double>(dVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          poVar13 = std::ostream::_M_insert<double>(local_208);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
        else {
          if (local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1c8,
                       (iterator)
                       local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&uStack_170);
          }
          else {
            *local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = uStack_170;
            local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          dVar1 = GraphBase::inf_eval(graph,&local_1c8,model,10000);
          pptVar10 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
          ptVar8 = local_108._M_impl.super__Deque_impl_data._M_finish._M_last;
          ptVar7 = local_108._M_impl.super__Deque_impl_data._M_finish._M_first;
          ptVar6 = local_108._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pptVar18 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
          ptVar5 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
          ptVar4 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
          ((_Head_base<1UL,_double,_false> *)
          ((long)local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10))->_M_head_impl =
               dVar1 - local_208;
          local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          *(long *)local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
               (long)local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
          if (local_108._M_impl.super__Deque_impl_data._M_start._M_cur !=
              local_108._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
            super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
            super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
            super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
                 (_Head_base<3UL,_unsigned_long,_false>)
                 (_Head_base<3UL,_unsigned_long,_false>)
                 local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_168 = local_108._M_impl.super__Deque_impl_data._M_start._M_first;
            local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
            super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
            super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
            _M_head_impl = (double)local_108._M_impl.super__Deque_impl_data._M_start._M_first;
            local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
            super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
            super__Head_base<1UL,_double,_false>._M_head_impl =
                 (double)local_108._M_impl.super__Deque_impl_data._M_start._M_last;
            local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
            super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
                 (unsigned_long)local_108._M_impl.super__Deque_impl_data._M_start._M_node;
            local_58 = local_108._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_50 = local_108._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_48 = local_108._M_impl.super__Deque_impl_data._M_finish._M_last;
            local_40 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
            uVar16 = ((long)local_108._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_108._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
                     ((long)local_108._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_108._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
                     ((((ulong)((long)local_108._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_108._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) +
                     (ulong)(local_108._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x10;
            lVar15 = 0x3f;
            if (uVar16 != 0) {
              for (; uVar16 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            std::
            __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>>
                      (&local_1a8,&local_58,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
            local_78 = ptVar4;
            local_70 = local_168;
            local_68 = ptVar5;
            local_60 = pptVar18;
            local_98 = ptVar6;
            local_90 = ptVar7;
            local_88 = ptVar8;
            local_80 = pptVar10;
            std::
            __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>>
                      (&local_78,&local_98);
          }
        }
        if (local_1b0 <= local_210) goto LAB_0011a820;
      }
      if (local_108._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_108._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_108._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_108._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_108._M_impl.super__Deque_impl_data._M_start._M_last =
             local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
        local_108._M_impl.super__Deque_impl_data._M_start._M_first =
             local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_108._M_impl.super__Deque_impl_data._M_start._M_node =
             local_108._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
    } while (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_108._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
LAB_0011a820:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End UC",6);
  pvVar19 = local_a0;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start CB",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_1f8 = 0.0;
  if (0.0 < local_1b0) {
    local_1f8 = 0.0;
    local_210 = 0.0;
    do {
      while (((local_158._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
             super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
             super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
             _M_head_impl + local_210 <= local_1b0) {
        if (local_158._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_158._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011ad67;
        local_188 = ((local_158._M_impl.super__Deque_impl_data._M_start._M_cur)->
                    super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                    super__Tuple_impl<2UL,_double,_unsigned_long>.
                    super__Tuple_impl<3UL,_unsigned_long>.
                    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl;
        dStack_180 = ((local_158._M_impl.super__Deque_impl_data._M_start._M_cur)->
                     super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                     super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                     super__Tuple_impl<2UL,_double,_unsigned_long>.
                     super__Head_base<2UL,_double,_false>._M_head_impl;
        local_178 = ((local_158._M_impl.super__Deque_impl_data._M_start._M_cur)->
                    super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                    super__Head_base<1UL,_double,_false>._M_head_impl;
        uStack_170 = ((local_158._M_impl.super__Deque_impl_data._M_start._M_cur)->
                     super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                     super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        if (local_188 ==
            (long)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) {
          if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1e8,
                       (iterator)
                       local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&uStack_170);
          }
          else {
            *local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = uStack_170;
            local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          if (local_158._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_158._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_158._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_158._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_158._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_158._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_158._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
            local_158._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_158._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_158._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_158._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_158._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          local_210 = local_210 + dStack_180;
          local_1f8 = GraphBase::inf_eval(graph,&local_1e8,model,10000);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"CB push new seed: ",0x12);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          if ((long)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0) {
            dVar1 = 0.0;
          }
          else {
            lVar15 = (long)local_1e8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1e8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            dVar1 = 0.0;
            lVar17 = 0;
            do {
              dVar1 = dVar1 + (local_160->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start
                              [local_1e8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar17]];
              lVar17 = lVar17 + 1;
            } while (lVar15 + (ulong)(lVar15 == 0) != lVar17);
          }
          poVar13 = std::ostream::_M_insert<double>(dVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          poVar13 = std::ostream::_M_insert<double>(local_1f8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
        else {
          if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1e8,
                       (iterator)
                       local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&uStack_170);
          }
          else {
            *local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = uStack_170;
            local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          dVar1 = GraphBase::inf_eval(graph,&local_1e8,model,10000);
          pptVar10 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node;
          ptVar7 = local_158._M_impl.super__Deque_impl_data._M_finish._M_first;
          ptVar6 = local_158._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pptVar18 = local_158._M_impl.super__Deque_impl_data._M_start._M_node;
          ptVar5 = local_158._M_impl.super__Deque_impl_data._M_start._M_last;
          ptVar4 = local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
          ((_Head_base<1UL,_double,_false> *)
          ((long)local_158._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10))->_M_head_impl =
               (dVar1 - local_1f8) / dStack_180;
          local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          *(long *)local_158._M_impl.super__Deque_impl_data._M_start._M_cur =
               (long)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
          if (local_158._M_impl.super__Deque_impl_data._M_start._M_cur !=
              local_158._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
            super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
            super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
            super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
                 (_Head_base<3UL,_unsigned_long,_false>)
                 (_Head_base<3UL,_unsigned_long,_false>)
                 local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_38 = local_158._M_impl.super__Deque_impl_data._M_start._M_first;
            local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
            super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
            super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
            _M_head_impl = (double)local_158._M_impl.super__Deque_impl_data._M_start._M_first;
            local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
            super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
            super__Head_base<1UL,_double,_false>._M_head_impl =
                 (double)local_158._M_impl.super__Deque_impl_data._M_start._M_last;
            local_1a8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
            super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
                 (unsigned_long)local_158._M_impl.super__Deque_impl_data._M_start._M_node;
            local_58 = local_158._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_50 = local_158._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_168 = local_158._M_impl.super__Deque_impl_data._M_finish._M_last;
            local_48 = local_158._M_impl.super__Deque_impl_data._M_finish._M_last;
            local_40 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node;
            uVar16 = ((long)local_158._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_158._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
                     ((long)local_158._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_158._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
                     ((((ulong)((long)local_158._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_158._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) +
                     (ulong)(local_158._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x10;
            lVar15 = 0x3f;
            if (uVar16 != 0) {
              for (; uVar16 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            std::
            __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>>
                      (&local_1a8,&local_58,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
            local_78 = ptVar4;
            local_70 = local_38;
            local_68 = ptVar5;
            local_60 = pptVar18;
            local_98 = ptVar6;
            local_90 = ptVar7;
            local_88 = local_168;
            local_80 = pptVar10;
            std::
            __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>>
                      (&local_78,&local_98);
          }
        }
        pvVar19 = local_a0;
        if (local_1b0 <= local_210) goto LAB_0011ad67;
      }
      if (local_158._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_158._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_158._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_158._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_158._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_158._M_impl.super__Deque_impl_data._M_start._M_last =
             local_158._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
        local_158._M_impl.super__Deque_impl_data._M_start._M_first =
             local_158._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_158._M_impl.super__Deque_impl_data._M_start._M_node =
             local_158._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_158._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_158._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
    } while (local_158._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_158._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
LAB_0011ad67:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CB end",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (local_1f8 <= local_208) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UC_inf: ",8);
    poVar13 = std::ostream::_M_insert<double>(local_208);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pvVar14 = &local_1c8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CB_inf: ",8);
    poVar13 = std::ostream::_M_insert<double>(local_1f8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pvVar14 = &local_1e8;
  }
  puVar2 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar2;
  (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::~_Deque_base(&local_158);
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::~_Deque_base(&local_108);
  if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pvVar19;
}

Assistant:

static std::vector<size_t> celfalgo(const Graph& graph, const double budget,
            const std::vector<double> & budget_list, const CascadeModel model) {
        std::vector<size_t> S_UC;
        std::vector<size_t> S_CB;
        std::deque<std::tuple<size_t, double, double, size_t>> Q_UC;  // u u.mg u.cost u.iter
        std::deque<std::tuple<size_t, double, double, size_t>> Q_CB;  // u u.mg/u.cost u.cost u.iter

        std::vector<size_t> vecSeed(1);

        clock_t startTime, endTime;
        startTime = clock();
        std::cout << "Initial deque start" << std::endl;
        for (size_t i = 0; i < graph.size(); i++){
            vecSeed[0] = i;
            double mg = GraphBase::inf_eval(graph, vecSeed, model);
            Q_UC.push_back(std::make_tuple(i, mg, budget_list[i], 0));
            Q_CB.push_back(std::make_tuple(i, mg / budget_list[i], budget_list[i], 0));
        }
        std::cout << "Initial deque end" << std::endl;
        endTime = clock();
        std::cout << double((endTime - startTime) / CLOCKS_PER_SEC) << " s" << std::endl;

        std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<2>(left) < std::get<2>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<2>(left) < std::get<2>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        std::cout << "Start UC" << std::endl;
        double budget_UC = 0;
        double S_UC_inf = 0;
        while(budget_UC < budget) {
            while(std::get<2>(Q_UC.front()) + budget_UC > budget){  // u u.mg u.cost u.iter
                Q_UC.pop_front();
                if(Q_UC.empty()){
                    break;
                }
            }
            if(Q_UC.empty()){
                break;
            }
            std::tuple<size_t, double, double, size_t> u = Q_UC.front();  // u u.mg u.cost u.iter
            if(std::get<3>(u) == S_UC.size()) {
                S_UC.push_back(std::get<0>(u));
                Q_UC.pop_front();
                budget_UC = budget_UC + std::get<2>(u);
                S_UC_inf = GraphBase::inf_eval(graph, S_UC, model);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_UC.size() << " " <<
                sum_budget(budget_list, S_UC) << " " << S_UC_inf << std::endl;
            }
            else {
                S_UC.push_back(std::get<0>(u));
                std::get<1>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                std::get<3>(Q_UC.front()) = S_UC.size();
                std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
                    if (std::get<1>(left) == std::get<1>(right)) {
                        return std::get<2>(left) < std::get<2>(right);
                    }
                    else {
                        return std::get<1>(left) > std::get<1>(right);
                    }
                });
            }
        }
        std::cout << "End UC" << std::endl;

        std::cout << "Start CB" << std::endl;
        double budget_CB = 0;
        double S_CB_inf = 0;
        while(budget_CB < budget) {
            while(std::get<2>(Q_CB.front()) + budget_CB > budget){
                Q_CB.pop_front();
                if(Q_CB.empty()){
                    break;
                }
            }
            if(Q_CB.empty()) {
                break;
            }
            std::tuple<size_t, double, double, size_t> u = Q_CB.front();  // u u.mg/u.cost u.cost u.iter
            if(std::get<3>(u) == S_CB.size()) {
                S_CB.push_back(std::get<0>(u));
                Q_CB.pop_front();
                budget_CB = budget_CB + std::get<2>(u);
                S_CB_inf = GraphBase::inf_eval(graph, S_CB, model);
                std::cout << "CB push new seed: " << std::get<0>(u) << " " << S_CB.size() << " " <<
                sum_budget(budget_list, S_CB) << " " << S_CB_inf << std::endl;
            }
            else {
                S_CB.push_back(std::get<0>(u));
                std::get<1>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) / std::get<2>(u);
                S_CB.pop_back();
                std::get<3>(Q_CB.front()) = S_CB.size();
                std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
                    if (std::get<1>(left) == std::get<1>(right)) {
                        return std::get<2>(left) < std::get<2>(right);
                    }
                    else {
                        return std::get<1>(left) > std::get<1>(right);
                    }
                });
            }
        }
        std::cout << "CB end" << std::endl;

        if (S_CB_inf > S_UC_inf) {
            std::cout << "CB_inf: " << S_CB_inf << std::endl;
            return S_CB;
        }
        else {
            std::cout << "UC_inf: " << S_UC_inf << std::endl;
            return S_UC;
        }
    }